

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

iterator __thiscall
MinVR::VRDataIndex::_getEntry(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  iterator iVar4;
  long lVar5;
  size_type sVar6;
  reference __lhs;
  reference pvVar7;
  byte in_CL;
  char *in_RDX;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  iterator it;
  string testSpace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  int N;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  string validatedNameSpace;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_stack_fffffffffffffe08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  _Self local_178;
  string local_170 [32];
  _Base_ptr local_150;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  string local_118 [39];
  undefined1 local_f1 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  uint local_b4;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  VRDataIndex *in_stack_ffffffffffffff68;
  string local_88 [48];
  string local_58 [32];
  _Base_ptr local_38;
  byte local_21;
  _Base_ptr local_8;
  
  local_21 = in_CL & 1;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  if (*pcVar3 == '/') {
    iVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
            ::find(in_stack_fffffffffffffe08,(key_type *)0x10ef07);
    in_RDI[2].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar4._M_node;
    local_8 = (_Base_ptr)
              in_RDI[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    lVar5 = std::__cxx11::string::size();
    if ((lVar5 == 1) && (iVar2 = std::__cxx11::string::compare(in_RDX), iVar2 == 0)) {
      std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      local_38 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                 ::find(in_stack_fffffffffffffe08,(key_type *)0x10ef90);
      in_RDI[2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38;
      std::__cxx11::string::~string(local_58);
      local_8 = (_Base_ptr)
                in_RDI[2].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      validateNameSpace(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if ((local_21 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        iVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                ::find(in_stack_fffffffffffffe08,(key_type *)0x10f05e);
        in_RDI[2].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar4._M_node;
        std::__cxx11::string::~string(local_b0);
        local_8 = (_Base_ptr)
                  in_RDI[2].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_b4 = 1;
      }
      else {
        _explodeName(in_RSI);
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_d0);
        for (local_f1._29_4_ = (undefined4)sVar6; -1 < (int)local_f1._29_4_;
            local_f1._29_4_ = local_f1._29_4_ + -1) {
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          __lhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_d0,0);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_d0,(size_type)__rhs);
          pvVar7 = pvVar7 + (int)local_f1._29_4_;
          __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x10f17e);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<std::__cxx11::string*,void>
                    (in_stack_fffffffffffffe50,__first,pvVar7,(allocator_type *)__lhs);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x10f1a9);
          std::__cxx11::string::string(local_118);
          local_120._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe08);
          while( true ) {
            local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffe08);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffe10,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffe08);
            if (!bVar1) break;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_120);
            std::operator+(__lhs,(char *)__rhs);
            std::__cxx11::string::operator+=(local_118,local_148);
            std::__cxx11::string::~string(local_148);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_120);
          }
          in_stack_fffffffffffffe20 = in_RDI;
          std::operator+(__lhs,__rhs);
          local_150 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                      ::find(in_stack_fffffffffffffe08,(key_type *)0x10f2fa);
          in_RDI[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_150;
          std::__cxx11::string::~string(local_170);
          in_stack_fffffffffffffe10 = in_RDI + 2;
          local_178._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
               ::end(in_stack_fffffffffffffe08);
          bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe10,&local_178);
          if (bVar1) {
            local_8 = (_Base_ptr)
                      in_RDI[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          local_b4 = (uint)bVar1;
          std::__cxx11::string::~string(local_118);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(in_stack_fffffffffffffe20);
          if (local_b4 != 0) goto LAB_0010f440;
        }
        iVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                ::end(in_stack_fffffffffffffe08);
        in_RDI[2].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar4._M_node;
        local_8 = (_Base_ptr)
                  in_RDI[2].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_b4 = 1;
LAB_0010f440:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffe20);
      }
      std::__cxx11::string::~string(local_88);
    }
  }
  return (iterator)local_8;
}

Assistant:

VRDataIndex::VRDataMap::iterator
VRDataIndex::_getEntry(const std::string &key,
                       const std::string nameSpace,
                       const bool inherit) {

  // If the input key begins with a "/", it is a fully qualified
  // name already.  That is, it already includes the name space.
  if (key[0] == '/') {

    _lastDatum = _theIndex.find(key);
    return _lastDatum;

  } else if ((nameSpace.size() == 1) && (nameSpace.compare("/") == 0)) {
    // If we are looking for something in the root name space, that's
    // not so different than using a fully-qualified name.

    _lastDatum = _theIndex.find(nameSpace + key);
    return _lastDatum;

  } else {

    // If you're asking whether a fully-qualified name works, you want
    // a yes or no answer.  If you're asking about a relative name, you will
    // accept a name defined in a namespace senior to the one
    // specified.  So answering the query for an entry to match the
    // given name requires looking through the senior namespaces.

    std::string validatedNameSpace = validateNameSpace(nameSpace);

    // If inheritance is turned off, just check if this name exists.
    if (!inherit) {
      _lastDatum = _theIndex.find(validatedNameSpace + key);
      return _lastDatum;
    }

    // Separate the name space into its constituent elements.
    std::vector<std::string> elems = _explodeName(validatedNameSpace);

    // We start from the longest name space and peel off the rightmost
    // element each iteration until we find a match, or not.  This
    // provides for the most local version of key to prevail.  The
    // last iteration creates an empty testSpace, on purpose, to test
    // the root level nameSpace.
    for (int N = (int)elems.size(); N >= 0; --N) {

      std::vector<std::string> names(&elems[0], &elems[0] + N);
      std::string testSpace;

      for (std::vector<std::string>::iterator it = names.begin();
           it != names.end(); ++it) {

        testSpace += *it + "/" ;
      }

      _lastDatum = _theIndex.find(testSpace + key);
      if (_lastDatum != _theIndex.end()) {
        return _lastDatum;
      }
    }

    // If we are here, there is no matching name in the index.
    _lastDatum = _theIndex.end();
    return _lastDatum;
  }
}